

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_outpoint.cpp
# Opt level: O0

void __thiscall
OutPoint_Constructor_Test::~OutPoint_Constructor_Test(OutPoint_Constructor_Test *this)

{
  OutPoint_Constructor_Test *this_local;
  
  ~OutPoint_Constructor_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(OutPoint, Constructor) {
  ByteData256 byte_data = ByteData256(
      "3412907856341290785634129078563412907856341290785634129078563412");
  Txid txid = Txid(byte_data);
  OutPoint outpoint(txid, 1);
  EXPECT_STREQ(
      outpoint.GetTxid().GetHex().c_str(),
      "1234567890123456789012345678901234567890123456789012345678901234");
  EXPECT_EQ(outpoint.GetVout(), 1);
}